

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShuffledDeckGenerator.cpp
# Opt level: O2

Deck * __thiscall
solitaire::cards::ShuffledDeckGenerator::generateSortedDeck
          (Deck *__return_storage_ptr__,ShuffledDeckGenerator *this)

{
  Value *pVVar1;
  Suit *pSVar2;
  ulong uVar3;
  Value *value;
  Value *pVVar4;
  Suit *suit;
  Suit *pSVar5;
  Card local_38;
  
  std::array<solitaire::cards::Card,_52UL>::array(__return_storage_ptr__);
  pSVar2 = DAT_00118290;
  uVar3 = 0;
  for (pSVar5 = suits; pVVar1 = DAT_00118278, pVVar4 = values, pSVar5 != pSVar2; pSVar5 = pSVar5 + 1
      ) {
    for (; pVVar4 != pVVar1; pVVar4 = pVVar4 + 1) {
      Card::Card(&local_38,*pVVar4,*pSVar5);
      *(Card *)(&__return_storage_ptr__->field_0x0 + uVar3 * 8) = local_38;
      uVar3 = (ulong)((int)uVar3 + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Deck ShuffledDeckGenerator::generateSortedDeck() const {
    Deck generatedDeck;
    unsigned index = 0;
    for (const auto& suit: suits)
        for (const auto& value: values)
            generatedDeck[index++] = Card {value, suit};
    return generatedDeck;
}